

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O2

void __thiscall FloatingDisplay::FloatingDisplay(FloatingDisplay *this,QWidget *mainWindow)

{
  QCursor *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Master *pMVar7;
  QSettings *pQVar8;
  LCDWidget *this_00;
  MidiMessageLEDWidget *this_01;
  QSize *pQVar9;
  QPoint QVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  anon_union_24_3_e3d07ef4_for_data local_90;
  QArrayDataPointer<char16_t> local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  
  pMVar7 = Master::getInstance();
  pQVar8 = Master::getSettings(pMVar7);
  QString::QString((QString *)&local_70,"FloatingDisplay/bypassWindowManager");
  QVariant::QVariant((QVariant *)&local_58,true);
  QSettings::value((QString *)&local_90,(QVariant *)pQVar8);
  uVar4 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_90);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QFrame::QFrame(&this->super_QFrame,0,(uVar4 & 0xff) << 10 | 0x4080b);
  *(undefined ***)this = &PTR_metaObject_001a65c0;
  *(undefined ***)&this->field_0x10 = &PTR__FloatingDisplay_001a6778;
  this->mainWindow = mainWindow;
  this->synthRoute = (SynthRoute *)0x0;
  this->lcdWidget = (LCDWidget *)0x0;
  this->midiMessageLED = (MidiMessageLEDWidget *)0x0;
  this->dragStatus = DRAG_STATUS_OFF;
  (this->dragOrigin).xp = 0;
  *(undefined8 *)&(this->dragOrigin).yp = 0;
  (this->startWindowPosition).yp = 0;
  QFrame::setFrameShape((Shadow)this);
  QFrame::setFrameShadow((Shadow)this);
  QString::QString((QString *)&local_90,"Munt: Display");
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
  pMVar7 = Master::getInstance();
  pQVar8 = Master::getSettings(pMVar7);
  QString::QString((QString *)&local_70,"FloatingDisplay/opacity");
  QVariant::QVariant((QVariant *)&local_58,100);
  QSettings::value((QString *)&local_90,(QVariant *)pQVar8);
  iVar5 = QVariant::toInt((bool *)local_90.data);
  QVariant::~QVariant((QVariant *)&local_90);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  iVar6 = 100;
  if (iVar5 < 100) {
    iVar6 = iVar5;
  }
  iVar5 = 0x19;
  if (0x19 < iVar6) {
    iVar5 = iVar6;
  }
  QWidget::setWindowOpacity((double)iVar5 / 100.0);
  iVar6 = QFrame::frameWidth();
  this_00 = (LCDWidget *)operator_new(0x78);
  LCDWidget::LCDWidget(this_00,(QWidget *)this);
  this->lcdWidget = this_00;
  iVar5 = QFrame::frameWidth();
  QWidget::move((QWidget *)this_00,iVar5 + 2,iVar6 + 2);
  this_01 = (MidiMessageLEDWidget *)operator_new(0x30);
  MidiMessageLEDWidget::MidiMessageLEDWidget(this_01,(QWidget *)this);
  this->midiMessageLED = this_01;
  pQVar9 = (QSize *)operator_new(0x28);
  QWidget::QWidget((QWidget *)pQVar9,this,0);
  this->sizeGrip = (QWidget *)pQVar9;
  QWidget::resize(pQVar9);
  pQVar1 = (QCursor *)this->sizeGrip;
  QCursor::QCursor((QCursor *)local_90.data,SizeFDiagCursor);
  QWidget::setCursor(pQVar1);
  QCursor::~QCursor((QCursor *)local_90.data);
  iVar5 = (**(code **)(*(long *)this->lcdWidget + 0x70))();
  this->baseWindowWidth = iVar5 + (iVar6 + 2) * 2 + 0xe;
  QString::QString((QString *)&local_70,"FloatingDisplay/geometry");
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  QSettings::value((QString *)&local_90,(QVariant *)pQVar8);
  auVar13 = QVariant::toRect();
  uVar12 = auVar13._0_8_;
  uVar11 = uVar12 >> 0x20;
  QVariant::~QVariant((QVariant *)&local_90);
  QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  if (auVar13._12_4_ < auVar13._4_4_ || auVar13._8_4_ < auVar13._0_4_) {
    layoutWidgets(this,this->baseWindowWidth);
    uVar2 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x14);
    uVar3 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x1c);
    QVar10 = QRect::center((QRect *)(*(long *)(mainWindow + 0x20) + 0x14));
    uVar12 = (ulong)(uint)(((int)uVar3 - (int)uVar2) / -2 + QVar10.xp);
    uVar11 = (ulong)(uint)(((int)((ulong)uVar3 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) / -2 +
                          QVar10.yp);
  }
  else {
    layoutWidgets(this,(auVar13._8_4_ - auVar13._0_4_) + 1);
    QWidget::size((QWidget *)this);
  }
  local_90.shared = (PrivateShared *)(uVar12 & 0xffffffff | uVar11 << 0x20);
  QWidget::move((QPoint *)this);
  adjustGeometryToScreen(this);
  return;
}

Assistant:

FloatingDisplay::FloatingDisplay(const QWidget *mainWindow) :
	QFrame(NULL, makeWindowFlags()),
	mainWindow(mainWindow), synthRoute(), lcdWidget(), midiMessageLED(), dragStatus()
{
	setFrameShape(QFrame::Box);
	setFrameShadow(QFrame::Raised);
	setWindowTitle("Munt: Display");

	QSettings *settings = Master::getInstance()->getSettings();
	int storedOpacity = settings->value("FloatingDisplay/opacity", 100).toInt();
	setWindowOpacity(qreal(qBound(MIN_OPACITY_VALUE, storedOpacity, 100) / 100.0));

	int frameWithMargin = frameWidth() + CONTENT_MARGIN;

	lcdWidget = new LCDWidget(this);
	lcdWidget->move(frameWidth() + CONTENT_MARGIN, frameWithMargin);

	midiMessageLED = new MidiMessageLEDWidget(this);

	sizeGrip = new QWidget(this);
	sizeGrip->resize(SIZE_GRIP_SIZE);
	sizeGrip->setCursor(Qt::SizeFDiagCursor);

	baseWindowWidth = lcdWidget->sizeHint().width() + MIDI_MESSAGE_LED_SIZE.width() + 2 * frameWithMargin + LAYOUT_SPACING;
	QRect rect = settings->value("FloatingDisplay/geometry").toRect();
	if (rect.isValid()) {
		layoutWidgets(rect.width());
		rect.setSize(size());
	} else {
		layoutWidgets(baseWindowWidth);
		rect = geometry();
		rect.moveCenter(mainWindow->geometry().center());
	}
	move(rect.topLeft());
	adjustGeometryToScreen();
}